

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerBreakpointManager.cxx
# Opt level: O3

int testDebuggerBreakpointManager(int param_1,char **param_2)

{
  bool bVar1;
  int iVar2;
  _Any_data *p_Var3;
  code **ppcVar4;
  long lVar5;
  initializer_list<std::function<bool_()>_> __l;
  allocator_type local_99;
  vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_> local_98;
  function<bool_()> local_80;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30 [2];
  
  local_80.super__Function_base._M_functor._8_8_ = 0;
  local_80.super__Function_base._M_functor._M_unused._M_object =
       testHandleBreakpointRequestBeforeFileIsLoaded;
  local_80._M_invoker = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_80.super__Function_base._M_manager = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager
  ;
  local_58 = 0;
  local_60 = testHandleBreakpointRequestAfterFileIsLoaded;
  local_48 = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_50 = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager;
  local_38 = 0;
  local_40 = testSourceFileLoadedAfterHandleBreakpointRequest;
  local_30[1] = std::_Function_handler<bool_(),_bool_(*)()>::_M_invoke;
  local_30[0] = std::_Function_handler<bool_(),_bool_(*)()>::_M_manager;
  __l._M_len = 3;
  __l._M_array = &local_80;
  std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::vector
            (&local_98,__l,&local_99);
  p_Var3 = (_Any_data *)
           local_98.
           super__Vector_base<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (p_Var3 == (_Any_data *)
                  local_98.
                  super__Vector_base<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Passed",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      iVar2 = 0;
      std::ostream::flush();
LAB_001f9221:
      std::vector<std::function<bool_()>,_std::allocator<std::function<bool_()>_>_>::~vector
                (&local_98);
      lVar5 = -0x60;
      ppcVar4 = &local_40;
      do {
        if (ppcVar4[2] != (code *)0x0) {
          (*ppcVar4[2])(ppcVar4,ppcVar4,3);
        }
        ppcVar4 = ppcVar4 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      return iVar2;
    }
    if (*(long *)(p_Var3 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3);
    if (!bVar1) {
      iVar2 = 1;
      goto LAB_001f9221;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
    p_Var3 = p_Var3 + 2;
  } while( true );
}

Assistant:

int testDebuggerBreakpointManager(int, char*[])
{
  return runTests(std::vector<std::function<bool()>>{
    testHandleBreakpointRequestBeforeFileIsLoaded,
    testHandleBreakpointRequestAfterFileIsLoaded,
    testSourceFileLoadedAfterHandleBreakpointRequest,
  });
}